

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handles<VkRayTracingPipelineCreateInfoKHR>
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *info)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  
  if (info->stageCount == 0) {
    return true;
  }
  lVar3 = 0;
  uVar2 = 0;
  do {
    bVar1 = remap_shader_module_handle
                      (this,(VkPipelineShaderStageCreateInfo *)((long)&info->pStages->sType + lVar3)
                      );
    if (!bVar1) {
      return bVar1;
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x30;
  } while (uVar2 < info->stageCount);
  return bVar1;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handles(CreateInfo *info)
{
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);
		if (!remap_shader_module_handle(stage))
			return false;
	}

	return true;
}